

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::
testCreateTransformFeedbacksForInvalidNumberOfObjects(ErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_28;
  int local_24;
  GLenum error;
  GLuint xfbs;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar1);
  local_24 = 0x4cb2f;
  (**(code **)(_error + 0x408))(0xffffffff,&local_24);
  local_28 = (**(code **)(_error + 0x800))();
  if (local_28 == 0x501) {
    if (local_24 == 0x4cb2f) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_358,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_358,
                          (char (*) [116])
                          "glCreateTransformFeedbacks called with negative number of objects had been expected not to change the given buffer."
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [124])
                        "glCreateTransformFeedbacks called with negative number of objects had been expected to generate GL_INVALID_VALUE. However, "
                       );
    EVar6 = glu::getErrorStr(local_28);
    local_1d8 = EVar6.m_getName;
    local_1d0 = EVar6.m_value;
    local_1c8[0].m_getName = local_1d8;
    local_1c8[0].m_value = local_1d0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])" was captured.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ErrorsTest::testCreateTransformFeedbacksForInvalidNumberOfObjects()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint xfbs = 314159;

	gl.createTransformFeedbacks(-1 /* invalid count */, &xfbs);

	glw::GLenum error = gl.getError();

	if (GL_INVALID_VALUE != error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glCreateTransformFeedbacks called with negative number of objects had "
											   "been expected to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != xfbs)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glCreateTransformFeedbacks called with negative number of objects had "
											   "been expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}